

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

ByteMaskType * __thiscall
hexpattern::getbytemask(ByteMaskType *__return_storage_ptr__,hexpattern *this)

{
  size_t *psVar1;
  pointer *ppuVar2;
  initializer_list<int> __l;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference __x;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  byte local_26a;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_228;
  const_iterator local_220;
  uchar *local_218;
  uchar *local_210;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_208;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_200;
  const_iterator local_1f8;
  uchar *local_1f0;
  undefined1 local_1e8 [16];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  const_iterator local_1d0;
  uchar *local_1c8;
  undefined1 local_1c0 [16];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  const_iterator local_1a8;
  undefined1 local_1a0 [8];
  ByteMaskType binary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *chunk;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  ByteVector mask;
  ByteVector data;
  _Rb_tree_const_iterator<int> local_118;
  _Self local_110;
  byte local_101;
  _Rb_tree_const_iterator<int> _Stack_100;
  bool endianconvert;
  undefined1 local_f8;
  value_type_conflict local_ec;
  reference local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> sizes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chunks;
  allocator<int> local_6a;
  less<int> local_69;
  int local_68 [4];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  set<int,_std::less<int>,_std::allocator<int>_> oksizes;
  hexpattern *this_local;
  
  local_68[0] = 4;
  local_68[1] = 8;
  local_68[2] = 0x10;
  local_68[3] = 0x20;
  local_58 = local_68;
  local_50 = 4;
  oksizes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::allocator<int>::allocator(&local_6a);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48,__l,&local_69,&local_6a);
  std::allocator<int>::~allocator(&local_6a);
  getchunks_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  psVar1 = &sizes._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
  c = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar1);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&c);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    local_e8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (local_e8);
    local_ec = (value_type_conflict)sVar4;
    pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_ec);
    _Stack_100 = pVar6.first._M_node;
    local_f8 = pVar6.second;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  local_26a = 0;
  if (sVar5 == 1) {
    local_118._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
    __x = std::_Rb_tree_const_iterator<int>::operator*(&local_118);
    local_110._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48,__x);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
    bVar3 = std::operator==(&local_110,
                            (_Self *)&data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_26a = bVar3 ^ 0xff;
  }
  local_101 = local_26a & 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1);
  psVar1 = &sizes._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)psVar1);
  chunk = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar1);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&chunk);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    binary.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1_1);
    decodechunk((ByteMaskType *)local_1a0,this,
                (string *)
                binary.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((local_101 & 1) == 0) {
      ppuVar2 = &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_200._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar2);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_1f8,&local_200);
      local_208._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
      local_210 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_1a0);
      local_218 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)ppuVar2
                                      ,local_1f8,local_208,
                                      (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )local_210);
      local_228._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_220,&local_228);
      ppuVar2 = &binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar2);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar2);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&__range1_1,local_220,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
    }
    else {
      ppuVar2 = &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_1b0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar2);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_1a8,&local_1b0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1c0 + 8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
      local_1c8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)ppuVar2
                                      ,local_1a8,
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)(local_1c0 + 8),
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_1c0);
      local_1d8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_1d0,&local_1d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1e8 + 8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
      local_1f0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                      &__range1_1,local_1d0,
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)(local_1e8 + 8),
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_1e8);
    }
    std::
    pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~pair((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)local_1a0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  make_pair<std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteMaskType getbytemask()
    {
        // do a byteswap when the entire pattern consists of 16, 32, 64 or 128 bit chunks.
        std::set<int> oksizes = { 4, 8, 16, 32 };

        auto chunks = getchunks();
        std::set<int> sizes;
        for (auto& c : chunks)
            sizes.insert(c.size());

        bool endianconvert = (sizes.size() == 1) && (oksizes.find(*sizes.begin()) != oksizes.end());

        ByteVector data;
        ByteVector mask;
        for (auto & chunk : chunks) {
            auto binary = decodechunk(chunk);
            if (endianconvert) {
                data.insert(data.end(), binary.first.rbegin(), binary.first.rend());
                mask.insert(mask.end(), binary.second.rbegin(), binary.second.rend());
            }
            else {
                data.insert(data.end(), binary.first.begin(), binary.first.end());
                mask.insert(mask.end(), binary.second.begin(), binary.second.end());
            }
        }

        return std::make_pair(data, mask);
    }